

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O2

SUNErrCode SUNMemoryHelper_Destroy(SUNMemoryHelper helper)

{
  _func_SUNErrCode_SUNMemoryHelper *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  if (helper != (SUNMemoryHelper)0x0) {
    UNRECOVERED_JUMPTABLE = helper->ops->destroy;
    if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNMemoryHelper *)0x0) {
      SVar1 = (*UNRECOVERED_JUMPTABLE)(helper);
      return SVar1;
    }
    free(helper->ops);
    free(helper);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMemoryHelper_Destroy(SUNMemoryHelper helper)
{
  SUNErrCode err = SUN_SUCCESS;
  SUNFunctionBegin(helper->sunctx);

  if (!helper) { return err; }

  if (helper->content)
  {
    SUNAssert(helper->ops->destroy, SUN_ERR_NOT_IMPLEMENTED);
  }

  if (helper->ops->destroy)
  {
    /* user helper defined destroy */
    err = helper->ops->destroy(helper);
  }
  else
  {
    /* default destroy */
    free(helper->ops);
    free(helper);
  }

  return err;
}